

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O0

int FindMode(int seqnum,int mode)

{
  int iVar1;
  FSoundSequence **ppFVar2;
  FName local_2c;
  int local_28;
  int local_24;
  int i;
  int nummodes;
  FSoundSequence *seq;
  int local_10;
  int mode_local;
  int seqnum_local;
  
  mode_local = seqnum;
  if (0 < seqnum) {
    seq._4_4_ = mode;
    local_10 = seqnum;
    ppFVar2 = TArray<FSoundSequence_*,_FSoundSequence_*>::operator[]
                        (&Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>,(long)seqnum);
    _i = *ppFVar2;
    if ((_i->Script[0] & 0xffU) == 0x10) {
      local_24 = _i->Script[0] >> 8;
      for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
        if (_i->Script[local_28 * 2 + 1] == seq._4_4_) {
          FName::FName(&local_2c,_i->Script[local_28 * 2 + 2]);
          iVar1 = FindSequence(&local_2c);
          return iVar1;
        }
      }
      mode_local = local_10;
    }
    else {
      mode_local = local_10;
    }
  }
  return mode_local;
}

Assistant:

static int FindMode(int seqnum, int mode)
{
	if (seqnum <= 0)
	{ // Sequence does not exist.
		return seqnum;
	}
	FSoundSequence *seq = Sequences[seqnum];
	if (GetCommand(seq->Script[0]) != SS_CMD_SELECT)
	{ // This sequence doesn't select any others.
		return seqnum;
	}
	// Search for the desired mode amongst the selections
	int nummodes = GetData(seq->Script[0]);
	for (int i = 0; i < nummodes; ++i)
	{
		if (seq->Script[1 + i*2] == mode)
		{
			return FindSequence(ENamedName(seq->Script[1 + i*2 + 1]));
		}
	}
	// The mode isn't selected, which means it stays on this sequence.
	return seqnum;
}